

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool __thiscall sf::VertexBuffer::update(VertexBuffer *this,VertexBuffer *vertexBuffer)

{
  long lVar1;
  PFNGLBUFFERDATAARBPROC p_Var2;
  GLboolean GVar3;
  GLboolean GVar4;
  GLenum GVar5;
  void *__dest;
  void *__src;
  long in_RSI;
  long in_RDI;
  GLboolean destinationResult;
  GLboolean sourceResult;
  void *source;
  void *destination;
  TransientContextLock contextLock;
  undefined6 in_stack_ffffffffffffff80;
  GLboolean in_stack_ffffffffffffff86;
  GLboolean in_stack_ffffffffffffff87;
  TransientContextLock *in_stack_ffffffffffffff90;
  bool local_1;
  
  if ((*(int *)(in_RDI + 8) == 0) || (*(int *)(in_RSI + 8) == 0)) {
    local_1 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffff90);
    priv::ensureExtensionsInit();
    if (SF_GLAD_GL_ARB_copy_buffer == 0) {
      (*sf_glad_glBindBufferARB)(0x8892,*(GLuint *)(in_RDI + 8));
      p_Var2 = sf_glad_glBufferDataARB;
      lVar1 = *(long *)(in_RSI + 0x10);
      GVar5 = anon_unknown.dwarf_3d7f43::VertexBufferImpl::usageToGlEnum(*(Usage *)(in_RDI + 0x1c));
      (*p_Var2)(0x8892,lVar1 * 0x14,(void *)0x0,GVar5);
      __dest = (*sf_glad_glMapBufferARB)(0x8892,0x88b9);
      (*sf_glad_glBindBufferARB)(0x8892,*(GLuint *)(in_RSI + 8));
      __src = (*sf_glad_glMapBufferARB)(0x8892,35000);
      memcpy(__dest,__src,*(long *)(in_RSI + 0x10) * 0x14);
      GVar3 = (*sf_glad_glUnmapBufferARB)(0x8892);
      in_stack_ffffffffffffff87 = GVar3;
      (*sf_glad_glBindBufferARB)(0x8892,*(GLuint *)(in_RDI + 8));
      GVar4 = (*sf_glad_glUnmapBufferARB)(0x8892);
      in_stack_ffffffffffffff86 = GVar4;
      (*sf_glad_glBindBufferARB)(0x8892,0);
      if ((GVar3 == '\0') || (GVar4 == '\0')) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      (*sf_glad_glBindBufferARB)(0x8f36,*(GLuint *)(in_RSI + 8));
      (*sf_glad_glBindBufferARB)(0x8f37,*(GLuint *)(in_RDI + 8));
      (*sf_glad_glCopyBufferSubData)(0x8f36,0x8f37,0,0,*(long *)(in_RSI + 0x10) * 0x14);
      (*sf_glad_glBindBufferARB)(0x8f37,0);
      (*sf_glad_glBindBufferARB)(0x8f36,0);
      local_1 = true;
    }
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  }
  return local_1;
}

Assistant:

bool VertexBuffer::update(const VertexBuffer& vertexBuffer)
{
#ifdef SFML_OPENGL_ES

    (void) vertexBuffer;
    return false;

#else

    if (!m_buffer || !vertexBuffer.m_buffer)
        return false;

    TransientContextLock contextLock;

    // Make sure that extensions are initialized
    sf::priv::ensureExtensionsInit();

    if (GLEXT_copy_buffer)
    {
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, vertexBuffer.m_buffer));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, m_buffer));

        glCheck(GLEXT_glCopyBufferSubData(GLEXT_GL_COPY_READ_BUFFER, GLEXT_GL_COPY_WRITE_BUFFER, 0, 0, static_cast<GLsizeiptr>(sizeof(Vertex) * vertexBuffer.m_size)));

        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, 0));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, 0));

        return true;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexBuffer.m_size), 0, VertexBufferImpl::usageToGlEnum(m_usage)));

    void* destination = 0;
    glCheck(destination = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_WRITE_ONLY));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, vertexBuffer.m_buffer));

    void* source = 0;
    glCheck(source = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_READ_ONLY));

    std::memcpy(destination, source, sizeof(Vertex) * vertexBuffer.m_size);

    GLboolean sourceResult = GL_FALSE;
    glCheck(sourceResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    GLboolean destinationResult = GL_FALSE;
    glCheck(destinationResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    if ((sourceResult == GL_FALSE) || (destinationResult == GL_FALSE))
        return false;

    return true;

#endif // SFML_OPENGL_ES
}